

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_xlat.cpp
# Opt level: O2

void P_TranslateTeleportThings(void)

{
  int iVar1;
  bool bVar2;
  AActor *this;
  int *piVar3;
  long lVar4;
  bool bVar5;
  TThinkerIterator<AActor> iterator;
  
  TThinkerIterator<AActor>::TThinkerIterator(&iterator,NAME_TeleportDest,0x80);
  bVar5 = false;
  while (this = (AActor *)FThinkerIterator::Next(&iterator.super_FThinkerIterator,false),
        this != (AActor *)0x0) {
    bVar2 = FTagManager::SectorHasTags(&tagManager,this->Sector);
    if (!bVar2) {
      this->tid = 1;
      AActor::AddToHash(this);
      bVar5 = true;
    }
  }
  if (bVar5) {
    piVar3 = lines->args + 2;
    for (lVar4 = 0; lVar4 < numlines; lVar4 = lVar4 + 1) {
      iVar1 = piVar3[-3];
      if (iVar1 == 0x27) {
LAB_004688f8:
        iVar1 = piVar3[-1];
joined_r0x00468913:
        if (iVar1 == 0) {
          piVar3[-2] = 1;
        }
      }
      else {
        if (iVar1 == 0x47) {
          iVar1 = *piVar3;
          goto joined_r0x00468913;
        }
        if (iVar1 == 0x46) goto LAB_004688f8;
      }
      piVar3 = piVar3 + 0x26;
    }
  }
  return;
}

Assistant:

void P_TranslateTeleportThings ()
{
	AActor *dest;
	TThinkerIterator<AActor> iterator(NAME_TeleportDest);
	bool foundSomething = false;

	while ( (dest = iterator.Next()) )
	{
		if (!tagManager.SectorHasTags(dest->Sector))
		{
			dest->tid = 1;
			dest->AddToHash ();
			foundSomething = true;
		}
	}

	if (foundSomething)
	{
		for (int i = 0; i < numlines; ++i)
		{
			if (lines[i].special == Teleport)
			{
				if (lines[i].args[1] == 0)
				{
					lines[i].args[0] = 1;
				}
			}
			else if (lines[i].special == Teleport_NoFog)
			{
				if (lines[i].args[2] == 0)
				{
					lines[i].args[0] = 1;
				}
			}
			else if (lines[i].special == Teleport_ZombieChanger)
			{
				if (lines[i].args[1] == 0)
				{
					lines[i].args[0] = 1;
				}
			}
		}
	}
}